

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  undefined7 in_register_00000011;
  bool *pbVar1;
  bool *pbVar2;
  CappedArray<char,_3UL> CVar3;
  DebugExpression<const_bool_&> _kjCondition;
  unsigned_long i;
  Array<unsigned_char> local_70;
  bool local_58 [8];
  CappedArray<char,_3UL> local_50;
  CappedArray<char,_3UL> local_40;
  
  local_70.ptr = (result->super_Array<unsigned_char>).ptr;
  local_70.size_ = (result->super_Array<unsigned_char>).size_;
  local_70.disposer = (result->super_Array<unsigned_char>).disposer;
  (result->super_Array<unsigned_char>).ptr = (uchar *)0x0;
  (result->super_Array<unsigned_char>).size_ = 0;
  local_58[0] = result->hadErrors;
  if ((int)CONCAT71(in_register_00000011,errors) == 0) {
    _kjCondition.value = (bool *)(CONCAT71(_kjCondition.value._1_7_,local_58[0]) ^ 1);
    if ((local_58[0] != false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                 (char (*) [35])"failed: expected !result.hadErrors",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  else {
    _kjCondition.value = local_58;
    if ((local_58[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
                 (char (*) [34])"failed: expected result.hadErrors",&_kjCondition);
    }
  }
  _kjCondition.value = (bool *)local_70.size_;
  if (((undefined1 *)local_70.size_ != &DAT_00000004) && (kj::_::Debug::minSeverity < 3)) {
    local_40.currentSize = local_70.size_;
    local_50.currentSize = 4;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,&local_40.currentSize,
               &local_50.currentSize);
  }
  pbVar1 = (bool *)&DAT_00000004;
  if (local_70.size_ < &DAT_00000004) {
    pbVar1 = (bool *)local_70.size_;
  }
  for (pbVar2 = (bool *)0x0; pbVar1 != pbVar2; pbVar2 = pbVar2 + 1) {
    _kjCondition.value = (bool *)(local_70.ptr + pbVar2);
    i = (unsigned_long)pbVar2;
    if (((bool)local_70.ptr[(long)pbVar2] != pbVar2[(long)*expected]) &&
       (kj::_::Debug::minSeverity < 3)) {
      CVar3 = anon_unknown_0::hex(*_kjCondition.value);
      local_40.currentSize = CVar3.currentSize;
      local_40.content._0_2_ = CVar3.content._0_2_;
      local_40.content[2] = CVar3.content[2];
      CVar3 = anon_unknown_0::hex((*expected)[i]);
      local_50.currentSize = CVar3.currentSize;
      local_50.content._0_2_ = CVar3.content._0_2_;
      local_50.content[2] = CVar3.content[2];
      kj::_::Debug::
      log<char_const(&)[42],kj::_::DebugComparison<unsigned_char&,unsigned_char_const&>&,unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",
                 (DebugComparison<unsigned_char_&,_const_unsigned_char_&> *)&_kjCondition,&i,
                 &local_40,&local_50);
    }
  }
  Array<unsigned_char>::~Array(&local_70);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}